

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError cbor_encode_negative_int(CborEncoder *encoder,uint64_t absolute_value)

{
  CborError CVar1;
  uint64_t absolute_value_local;
  CborEncoder *encoder_local;
  
  CVar1 = encode_number(encoder,absolute_value,' ');
  return CVar1;
}

Assistant:

CborError cbor_encode_negative_int(CborEncoder *encoder, uint64_t absolute_value)
{
    return encode_number(encoder, absolute_value, NegativeIntegerType << MajorTypeShift);
}